

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilClearTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::DepthStencilClearCase::iterate(DepthStencilClearCase *this)

{
  RenderContext *context;
  byte bVar1;
  deUint32 dVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  RenderTarget *pRVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Surface *pSVar10;
  NotSupportedError *this_00;
  TestError *this_01;
  Clear *__cur;
  undefined8 *puVar11;
  uint uVar12;
  int *piVar13;
  int ndx;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int x_1;
  undefined1 uVar19;
  uint uVar18;
  uint uVar20;
  uint uVar21;
  int ndx_1;
  int x;
  int iVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  Surface reference;
  RGBA threshold;
  TextureLevel depthBufRow;
  PixelBufferAccess rowAccess;
  Surface result;
  undefined8 *local_108;
  undefined8 *local_100;
  Surface local_e8;
  uint local_cc;
  ulong local_c8;
  RGBA local_bc;
  undefined1 local_b8 [24];
  void *local_a0;
  float local_98;
  undefined8 local_94;
  float local_8c;
  ConstPixelBufferAccess local_80;
  Vec4 local_58;
  Surface local_48;
  
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar9->m_width;
  iVar8 = pRVar9->m_height;
  tcu::Surface::Surface(&local_48,iVar3,iVar8);
  tcu::Surface::Surface(&local_e8,iVar3,iVar8);
  iVar3 = (pRVar9->m_pixelFormat).alphaBits;
  bVar1 = 8 - (char)(pRVar9->m_pixelFormat).redBits;
  uVar20 = 0;
  if (0 < iVar3) {
    uVar20 = 0x1000000 << (8U - (char)iVar3 & 0x1f);
  }
  uVar18 = 0x100 << (8U - (char)(pRVar9->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar1 & 0x1f);
  uVar20 = 0x10000 << (8U - (char)(pRVar9->m_pixelFormat).blueBits & 0x1f) | uVar18 | uVar20;
  uVar12 = 1 << (bVar1 & 0x1f) & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  uVar18 = uVar18 >> 8 & 0xff;
  if (0xfd < uVar18) {
    uVar18 = 0xfe;
  }
  uVar21 = uVar20 >> 0x10 & 0xff;
  if (0xfd < uVar21) {
    uVar21 = 0xfe;
  }
  uVar20 = uVar20 >> 0x18;
  if (0xfd < uVar20) {
    uVar20 = 0xfe;
  }
  local_bc.m_value = uVar20 * 0x1000000 + (uVar21 << 0x10 | uVar18 << 8 | uVar12) + 0x1010101;
  if (((this->m_testDepth == true) && (pRVar9->m_depthBits == 0)) ||
     ((this->m_testStencil == true && (pRVar9->m_stencilBits == 0)))) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"No depth/stencil buffers",::glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
               ,0xd3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar2 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar20 = this->m_curIter;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  uVar20 = (uVar20 >> 0x10 ^ uVar20 ^ 0x3d) * 9;
  uVar20 = (uVar20 >> 4 ^ uVar20) * 0x27d4eb2d;
  local_c8 = CONCAT44(local_c8._4_4_,*(undefined4 *)CONCAT44(extraout_var,iVar3));
  local_cc = ((undefined4 *)CONCAT44(extraout_var,iVar3))[1];
  deRandom_init((deRandom *)local_b8,uVar20 >> 0xf ^ dVar2 ^ uVar20);
  lVar15 = (long)this->m_numClears;
  if (lVar15 == 0) {
    local_100 = (undefined8 *)0x0;
    local_108 = (undefined8 *)0x0;
  }
  else {
    if (this->m_numClears < 0) {
      std::__throw_length_error("vector::_M_default_append");
    }
    local_108 = (undefined8 *)operator_new(lVar15 * 0x28);
    puVar11 = local_108;
    lVar16 = lVar15;
    do {
      *(undefined4 *)((long)puVar11 + 0x24) = 0;
      *puVar11 = 0;
      *(undefined8 *)((long)puVar11 + 5) = 0;
      puVar11[2] = 0;
      puVar11[3] = 0;
      *(undefined1 *)(puVar11 + 4) = 0;
      puVar11 = puVar11 + 5;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
    local_100 = local_108 + lVar15 * 5;
    uVar17 = 0;
    do {
      bVar23 = this->m_testScissor == true;
      if (bVar23) {
        dVar2 = deRandom_getUint32((deRandom *)local_b8);
        uVar12 = dVar2 % (uint)local_c8;
        dVar2 = deRandom_getUint32((deRandom *)local_b8);
        uVar20 = dVar2 % local_cc;
        dVar2 = deRandom_getUint32((deRandom *)local_b8);
        dVar4 = deRandom_getUint32((deRandom *)local_b8);
        *(uint *)((long)local_108 + uVar17 + 0x10) = dVar2 % ((uint)local_c8 - uVar12);
        *(uint *)((long)local_108 + uVar17 + 0x14) = dVar4 % (local_cc - uVar20);
        *(uint *)((long)local_108 + uVar17 + 0x18) = uVar12 + 1;
        *(uint *)((long)local_108 + uVar17 + 0x1c) = uVar20 + 1;
      }
      *(bool *)((long)local_108 + uVar17 + 0xc) = bVar23;
      fVar24 = deRandom_getFloat((deRandom *)local_b8);
      *(float *)((long)local_108 + uVar17 + 4) = fVar24 * 1.4000001 + -0.2;
      dVar2 = deRandom_getUint32((deRandom *)local_b8);
      *(deUint32 *)((long)local_108 + uVar17 + 8) = dVar2;
      bVar1 = this->m_masked;
      bVar23 = true;
      if ((bool)bVar1 == true) {
        dVar5 = deRandom_getBool((deRandom *)local_b8);
        bVar23 = dVar5 == 1;
        bVar1 = this->m_masked;
      }
      *(bool *)((long)local_108 + uVar17 + 0x20) = bVar23;
      dVar2 = 0xffffffff;
      if ((bVar1 & 1) != 0) {
        dVar2 = deRandom_getUint32((deRandom *)local_b8);
      }
      *(deUint32 *)((long)local_108 + uVar17 + 0x24) = dVar2;
      uVar6 = 0x400;
      if ((this->m_testDepth == true) && (uVar6 = 0x100, this->m_testStencil == true)) {
        dVar2 = deRandom_getUint32((deRandom *)local_b8);
        uVar6 = *(undefined4 *)(&DAT_01bdef50 + (ulong)(dVar2 % 3) * 4);
      }
      *(undefined4 *)((long)local_108 + uVar17) = uVar6;
      uVar17 = uVar17 + 0x28;
    } while (lVar15 * 0x28 != uVar17);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var_00,iVar3);
  uVar6 = (**(code **)(lVar15 + 0xb48))((this->m_visProgram->m_program).m_program,"u_color");
  uVar7 = (**(code **)(lVar15 + 0x780))((this->m_visProgram->m_program).m_program,"a_position");
  (**(code **)(lVar15 + 0x1d0))(0x3f800000);
  (**(code **)(lVar15 + 0x208))(0);
  (**(code **)(lVar15 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar15 + 0x188))(0x4500);
  dVar2 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar2,"Before clears",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                  ,0x121);
  for (puVar11 = local_108; puVar11 != local_100; puVar11 = puVar11 + 5) {
    if (*(char *)((long)puVar11 + 0xc) == '\x01') {
      (**(code **)(lVar15 + 0x5e0))(0xc11);
      (**(code **)(lVar15 + 0x1290))
                (*(undefined4 *)(puVar11 + 2),*(undefined4 *)((long)puVar11 + 0x14),
                 *(undefined4 *)(puVar11 + 3),*(undefined4 *)((long)puVar11 + 0x1c));
    }
    (**(code **)(lVar15 + 0x1d0))(*(undefined4 *)((long)puVar11 + 4));
    (**(code **)(lVar15 + 0x208))(*(undefined4 *)(puVar11 + 1));
    (**(code **)(lVar15 + 0x4a8))(*(undefined1 *)(puVar11 + 4));
    (**(code **)(lVar15 + 0x12d8))(*(undefined4 *)((long)puVar11 + 0x24));
    (**(code **)(lVar15 + 0x188))(*(undefined4 *)puVar11);
    if (*(char *)((long)puVar11 + 0xc) == '\x01') {
      (**(code **)(lVar15 + 0x4e8))(0xc11);
    }
  }
  (**(code **)(lVar15 + 0x4a8))(1);
  (**(code **)(lVar15 + 0x12d8))(0xffffffff);
  dVar2 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar2,"After clears",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                  ,0x13e);
  (**(code **)(lVar15 + 0x1680))((this->m_visProgram->m_program).m_program);
  (**(code **)(lVar15 + 0x610))(uVar7);
  if (this->m_testDepth != false) {
    (**(code **)(lVar15 + 0x5e0))(0xb71);
    (**(code **)(lVar15 + 0x4a0))(0x201);
    (**(code **)(lVar15 + 0x4a8))(0);
    iVar3 = 0;
    (**(code **)(lVar15 + 0x238))(0,0,1,0);
    do {
      local_b8._8_4_ = (float)iVar3 * 0.0625 + -1.0;
      local_b8._0_4_ = 0xbf800000;
      local_b8._4_4_ = 0xbf800000;
      local_b8._12_4_ = -0x40800000;
      local_b8._16_4_ = 0x3f800000;
      local_a0 = (void *)0xbf8000003f800000;
      local_94 = 0x3f8000003f800000;
      local_b8._20_4_ = local_b8._8_4_;
      local_98 = (float)local_b8._8_4_;
      local_8c = (float)local_b8._8_4_;
      (**(code **)(lVar15 + 0x15a0))(0,0,(float)iVar3 / 31.0,0x3f800000,uVar6);
      (**(code **)(lVar15 + 0x19f0))(uVar7,3,0x1406,0,0,local_b8);
      (**(code **)(lVar15 + 0x568))(4,6,0x1401);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x20);
    (**(code **)(lVar15 + 0x4e8))(0xb71);
    (**(code **)(lVar15 + 0x4a8))(1);
    dVar2 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar2,"After depth visualization",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                    ,0x162);
  }
  if (this->m_testStencil == true) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar8 = 1 << (*(byte *)(CONCAT44(extraout_var_01,iVar3) + 0x1c) & 0x1f);
    iVar3 = iVar8 + 0x1f;
    if (-1 < iVar8) {
      iVar3 = iVar8;
    }
    (**(code **)(lVar15 + 0x5e0))(0xb90);
    (**(code **)(lVar15 + 0x12e8))(0x1e00,0x1e00,0x1e00);
    (**(code **)(lVar15 + 0x238))(0,1,0,0);
    iVar22 = 0;
    (**(code **)(lVar15 + 0x19f0))
              (uVar7,2,0x1406,0,0,
               renderGL(tcu::Surface&,std::vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>>const&)
               ::pos);
    iVar8 = 0;
    do {
      (**(code **)(lVar15 + 0x12c8))(0x203,iVar22,0xff);
      (**(code **)(lVar15 + 0x15a0))(0,(float)iVar8 / 31.0,0,0x3f800000,uVar6);
      (**(code **)(lVar15 + 0x568))
                (4,6,0x1401,
                 &renderGL(tcu::Surface&,std::vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>>const&)
                  ::indices);
      iVar8 = iVar8 + 1;
      iVar22 = iVar22 + (iVar3 >> 5);
    } while (iVar8 != 0x20);
    (**(code **)(lVar15 + 0x4e8))(0xb90);
    dVar2 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar2,"After stencil visualization",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                    ,0x184);
  }
  (**(code **)(lVar15 + 0x238))(1,1,1,1);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_80.m_format.order = RGBA;
  local_80.m_format.type = UNORM_INT8;
  if ((void *)local_48.m_pixels.m_cap != (void *)0x0) {
    local_48.m_pixels.m_cap = (size_t)local_48.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_b8,&local_80.m_format,local_48.m_width,local_48.m_height,1,
             (void *)local_48.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_b8);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_80.m_format.order = RGBA;
  local_80.m_format.type = UNORM_INT8;
  if ((void *)local_e8.m_pixels.m_cap != (void *)0x0) {
    local_e8.m_pixels.m_cap = (size_t)local_e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_b8,&local_80.m_format,local_e8.m_width,local_e8.m_height,1,
             (void *)local_e8.m_pixels.m_cap);
  local_58.m_data[0] = -1.7014636e+38;
  tcu::RGBA::toVec((RGBA *)&local_58);
  tcu::clear((PixelBufferAccess *)local_b8,(Vec4 *)&local_80);
  if (this->m_testDepth == true) {
    iVar8 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 0x18);
    uVar20 = iVar8 << 0x1d | iVar8 - 8U >> 3;
    if (3 < uVar20) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Can\'t map depth buffer format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                 ,99);
      goto LAB_00fdade3;
    }
    local_80.m_format = *(TextureFormat *)(&DAT_01bdef60 + (ulong)uVar20 * 8);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_b8,&local_80.m_format,local_e8.m_width,1,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_80,(TextureLevel *)local_b8);
    if (0 < local_e8.m_height) {
      iVar8 = 0;
      do {
        if (0 < local_80.m_size.m_data[0]) {
          iVar22 = 0;
          do {
            local_58.m_data[0] = 1.0;
            local_58.m_data[1] = 1.0;
            local_58.m_data[2] = 1.0;
            local_58.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&local_80,&local_58,iVar22,0,0);
            iVar22 = iVar22 + 1;
          } while (iVar22 < local_80.m_size.m_data[0]);
        }
        if (local_108 != local_100) {
          lVar15 = 0;
          puVar11 = local_108;
          do {
            if (((*(byte *)((long)puVar11 + 1) & 1) != 0) && (*(char *)(puVar11 + 4) == '\x01')) {
              iVar14 = 0;
              piVar13 = &local_e8.m_height;
              pSVar10 = &local_e8;
              iVar22 = 0;
              if (*(char *)((long)puVar11 + 0xc) == '\x01') {
                iVar22 = *(int *)(local_108 + lVar15 * 5 + 2);
                iVar14 = *(int *)((long)local_108 + lVar15 * 0x28 + 0x14);
                pSVar10 = (Surface *)(local_108 + lVar15 * 5 + 3);
                piVar13 = (int *)((long)local_108 + lVar15 * 0x28 + 0x1c);
              }
              if (((iVar14 <= iVar8) && (iVar8 < iVar14 + *piVar13)) &&
                 (iVar14 = pSVar10->m_width, iVar22 < iVar14 + iVar22)) {
                do {
                  fVar24 = *(float *)((long)puVar11 + 4);
                  fVar25 = 1.0;
                  if (fVar24 <= 1.0) {
                    fVar25 = fVar24;
                  }
                  tcu::PixelBufferAccess::setPixDepth
                            ((PixelBufferAccess *)&local_80,
                             (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar25),iVar22,0,0);
                  iVar22 = iVar22 + 1;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
            }
            puVar11 = puVar11 + 5;
            lVar15 = lVar15 + 1;
          } while (puVar11 != local_100);
        }
        if (0 < local_e8.m_width) {
          iVar22 = 0;
          do {
            fVar24 = tcu::ConstPixelBufferAccess::getPixDepth(&local_80,iVar22,0,0);
            fVar24 = floorf(fVar24 * 32.0);
            fVar24 = (fVar24 / 31.0) * 255.0;
            uVar12 = (uint)(fVar24 + *(float *)(&DAT_01b81694 + (ulong)(fVar24 < 0.0) * 4));
            uVar20 = 0xff;
            if (uVar12 < 0xff) {
              uVar20 = uVar12;
            }
            uVar19 = (undefined1)uVar20;
            if ((int)uVar12 < 0) {
              uVar19 = 0;
            }
            *(undefined1 *)
             ((long)local_e8.m_pixels.m_ptr + (long)(local_e8.m_width * iVar8 + iVar22) * 4 + 2) =
                 uVar19;
            iVar22 = iVar22 + 1;
          } while (iVar22 < local_e8.m_width);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < local_e8.m_height);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b8);
  }
  if (this->m_testStencil == true) {
    iVar3 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 0x1c);
    uVar20 = iVar3 << 0x1d | iVar3 - 8U >> 3;
    if (3 < uVar20) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Can\'t map depth buffer format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                 ,0x70);
LAB_00fdade3:
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_80.m_format = (TextureFormat)(((ulong)uVar20 << 0x20) + 0x1e00000013);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_b8,&local_80.m_format,local_e8.m_width,1,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_80,(TextureLevel *)local_b8);
    uVar20 = 1 << ((byte)iVar3 & 0x1f);
    if (0 < local_e8.m_height) {
      iVar3 = 0;
      local_c8 = (ulong)(uVar20 >> 5);
      do {
        if (0 < local_80.m_size.m_data[0]) {
          iVar8 = 0;
          do {
            local_58.m_data[0] = 0.0;
            local_58.m_data[1] = 0.0;
            local_58.m_data[2] = 0.0;
            local_58.m_data[3] = 0.0;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&local_80,(IVec4 *)&local_58,iVar8,0,0);
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_80.m_size.m_data[0]);
        }
        if (local_108 != local_100) {
          lVar15 = 0;
          puVar11 = local_108;
          do {
            if (((*(byte *)((long)puVar11 + 1) & 4) != 0) && (*(int *)((long)puVar11 + 0x24) != 0))
            {
              iVar22 = 0;
              piVar13 = &local_e8.m_height;
              pSVar10 = &local_e8;
              iVar8 = 0;
              if (*(char *)((long)puVar11 + 0xc) == '\x01') {
                iVar8 = *(int *)(local_108 + lVar15 * 5 + 2);
                iVar22 = *(int *)((long)local_108 + lVar15 * 0x28 + 0x14);
                pSVar10 = (Surface *)(local_108 + lVar15 * 5 + 3);
                piVar13 = (int *)((long)local_108 + lVar15 * 0x28 + 0x1c);
              }
              if (((iVar22 <= iVar3) && (iVar3 < iVar22 + *piVar13)) &&
                 (iVar22 = pSVar10->m_width, iVar8 < iVar22 + iVar8)) {
                do {
                  uVar12 = tcu::ConstPixelBufferAccess::getPixStencil(&local_80,iVar8,0,0);
                  tcu::PixelBufferAccess::setPixStencil
                            ((PixelBufferAccess *)&local_80,
                             ((*(uint *)(puVar11 + 1) ^ uVar12) & *(uint *)((long)puVar11 + 0x24) ^
                             uVar12) & uVar20 - 1,iVar8,0,0);
                  iVar8 = iVar8 + 1;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
            }
            puVar11 = puVar11 + 5;
            lVar15 = lVar15 + 1;
          } while (puVar11 != local_100);
        }
        uVar17 = local_c8;
        if (0 < local_e8.m_width) {
          iVar8 = 0;
          do {
            uVar12 = tcu::ConstPixelBufferAccess::getPixStencil(&local_80,iVar8,0,0);
            uVar18 = (uint)(((float)((ulong)uVar12 / (uVar17 & 0xffffffff)) / 31.0) * 255.0 + 0.5);
            uVar12 = 0xff;
            if (uVar18 < 0xff) {
              uVar12 = uVar18;
            }
            uVar19 = (undefined1)uVar12;
            if ((int)uVar18 < 0) {
              uVar19 = 0;
            }
            *(undefined1 *)
             ((long)local_e8.m_pixels.m_ptr + (long)(local_e8.m_width * iVar3 + iVar8) * 4 + 1) =
                 uVar19;
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_e8.m_width);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_e8.m_height);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b8);
  }
  iVar8 = this->m_curIter + 1;
  iVar3 = this->m_numIters;
  bVar23 = tcu::pixelThresholdCompare
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      "Result","Image comparison result",&local_e8,&local_48,&local_bc,
                      (iVar8 != iVar3) + COMPARE_LOG_RESULT);
  if (!bVar23) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  this->m_curIter = this->m_curIter + 1;
  if (local_108 != (undefined8 *)0x0) {
    operator_delete(local_108,(long)local_100 - (long)local_108);
  }
  tcu::Surface::~Surface(&local_e8);
  tcu::Surface::~Surface(&local_48);
  return (uint)(iVar8 != iVar3 && bVar23);
}

Assistant:

DepthStencilClearCase::IterateResult DepthStencilClearCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	int							width			= renderTarget.getWidth();
	int							height			= renderTarget.getHeight();
	tcu::Surface				result			(width, height);
	tcu::Surface				reference		(width, height);
	tcu::RGBA					threshold		= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<Clear>				clears;

	if ((m_testDepth && renderTarget.getDepthBits() == 0) ||
		(m_testStencil && renderTarget.getStencilBits() == 0))
		throw tcu::NotSupportedError("No depth/stencil buffers", "", __FILE__, __LINE__);

	generateClears(clears, deStringHash(getName())^deInt32Hash(m_curIter));
	renderGL(result, clears);
	renderReference(reference, clears);

	bool	isLastIter		= m_curIter+1 == m_numIters;
	bool	isOk			= tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, isLastIter ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curIter += 1;
	return isLastIter || !isOk ? STOP : CONTINUE;
}